

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<HLSLVertexAttributeRemapNamed,_8UL>::clear
          (SmallVector<HLSLVertexAttributeRemapNamed,_8UL> *this)

{
  HLSLVertexAttributeRemapNamed *pHVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size != 0) {
    lVar3 = 0x30;
    uVar4 = 0;
    do {
      pHVar1 = (this->super_VectorView<HLSLVertexAttributeRemapNamed>).ptr;
      pvVar2 = *(void **)((long)pHVar1 + lVar3 + -0x10);
      if ((void *)((long)&(pHVar1->name)._M_dataplus._M_p + lVar3) != pvVar2) {
        operator_delete(pvVar2);
      }
      pvVar2 = *(void **)((long)pHVar1 + lVar3 + -0x30);
      if ((void *)((long)pHVar1 + lVar3 + -0x20) != pvVar2) {
        operator_delete(pvVar2);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < (this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size);
  }
  (this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}